

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O1

size_t io::net::
       write<io::write_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::const_buffer,io::net::transfer_all,void>
                 (undefined8 stream,undefined8 buffers)

{
  size_t sVar1;
  system_error *this;
  error_code __ec;
  error_code ec;
  uint local_28 [2];
  error_category *local_20;
  
  local_28[0] = 0;
  local_20 = (error_category *)std::_V2::system_category();
  sVar1 = write<io::write_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::const_buffer,io::net::transfer_all,void>
                    (stream,buffers,local_28);
  if (local_28[0] == 0) {
    return sVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_28[0];
  __ec._M_cat = local_20;
  std::system_error::system_error(this,__ec,"write");
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t write(SyncWriteStream& stream,
                  const ConstBufferSequence& buffers,
                  CompletionCondition completion_condition)
{
    std::error_code ec;
    std::size_t bytes_written = write(stream, buffers,
                                      completion_condition, ec);
    if (ec) throw std::system_error(ec, __func__);
    return bytes_written;
}